

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SimdUint16x8<Js::OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  int iVar1;
  SIMDValue bValue;
  AsmJsSIMDValue result;
  uint16 values [8];
  OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I1);
  result.field_0.i16[4] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I2);
  result.field_0.i16[5] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I3);
  result.field_0.i16[6] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I4);
  result.field_0.i16[7] = (Type)iVar1;
  GetRegRawInt<unsigned_short>(this,playout->I5);
  GetRegRawInt<unsigned_short>(this,playout->I6);
  GetRegRawInt<unsigned_short>(this,playout->I7);
  GetRegRawInt<unsigned_short>(this,playout->I8);
  bValue = SIMDUint16x8Operation::OpUint16x8((uint16 *)(result.field_0.u32 + 2));
  SetRegRawSimd<unsigned_short>(this,playout->U8_0,(AsmJsSIMDValue)bValue.field_0);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdUint16x8(const unaligned T* playout)
    {

        uint16 values[8];
        values[0] = (uint16)GetRegRawInt(playout->I1);
        values[1] = (uint16)GetRegRawInt(playout->I2);
        values[2] = (uint16)GetRegRawInt(playout->I3);
        values[3] = (uint16)GetRegRawInt(playout->I4);
        values[4] = (uint16)GetRegRawInt(playout->I5);
        values[5] = (uint16)GetRegRawInt(playout->I6);
        values[6] = (uint16)GetRegRawInt(playout->I7);
        values[7] = (uint16)GetRegRawInt(playout->I8);

        AsmJsSIMDValue result = SIMDUint16x8Operation::OpUint16x8(values);
        SetRegRawSimd(playout->U8_0, result);
    }